

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepFrameBuffer::insert(DeepFrameBuffer *this,char *name,DeepSlice *slice)

{
  ArgExc *this_00;
  mapped_type *__dest;
  char *in_RDX;
  char *in_RSI;
  stringstream _iex_throw_s;
  Name *in_stack_fffffffffffffd40;
  key_type *in_stack_fffffffffffffd78;
  map<Imf_2_5::Name,_Imf_2_5::DeepSlice,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  *in_stack_fffffffffffffd80;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*in_RSI == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Frame buffer slice name cannot be an empty string.");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Name::Name(in_stack_fffffffffffffd40,in_RDX);
  __dest = std::
           map<Imf_2_5::Name,_Imf_2_5::DeepSlice,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
           ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  memcpy(__dest,in_RDX,0x38);
  return;
}

Assistant:

void
DeepFrameBuffer::insert (const char name[], const DeepSlice &slice)
{
    if (name[0] == 0)
    {
        THROW (IEX_NAMESPACE::ArgExc,
               "Frame buffer slice name cannot be an empty string.");
    }

    _map[name] = slice;
}